

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void explainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,int iLevel,int iFrom,
                   u16 wctrlFlags)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int p1;
  sqlite3 *db;
  Vdbe *p;
  Index *pIVar4;
  Column *pCVar5;
  int *piVar6;
  sqlite3_index_info *psVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  uint iTerm;
  ulong uVar17;
  bool bVar18;
  StrAccum local_58;
  
  if (pParse->explain != '\x02') {
    return;
  }
  uVar3 = (pLevel->plan).wsFlags;
  if ((uVar3 >> 0x1c & 1) != 0) {
    return;
  }
  if ((wctrlFlags & 0x40) != 0) {
    return;
  }
  bVar1 = pLevel->iFrom;
  db = pParse->db;
  p = pParse->pVdbe;
  p1 = pParse->iSelectId;
  pcVar9 = "SCAN";
  if ((pLevel->plan).nEq != 0) {
    pcVar9 = "SEARCH";
  }
  if ((uVar3 & 0x300000) != 0 || (wctrlFlags & 3) != 0) {
    pcVar9 = "SEARCH";
  }
  pcVar9 = sqlite3MPrintf(db,"%s",pcVar9);
  if (pTabList->a[bVar1].pSelect == (Select *)0x0) {
    pcVar9 = sqlite3MAppendf(db,pcVar9,"%s TABLE %s",pcVar9,pTabList->a[bVar1].zName);
  }
  else {
    pcVar9 = sqlite3MAppendf(db,pcVar9,"%s SUBQUERY %d",pcVar9,(ulong)pTabList->a[bVar1].iSelectId);
  }
  if (pTabList->a[bVar1].zAlias != (char *)0x0) {
    pcVar9 = sqlite3MAppendf(db,pcVar9,"%s AS %s");
  }
  if ((uVar3 & 0xf0000) == 0) {
    if ((uVar3 & 0x3000) == 0) {
      if ((uVar3 >> 0x1b & 1) != 0) {
        psVar7 = (pLevel->plan).u.pVtabIdx;
        pcVar9 = sqlite3MAppendf(db,pcVar9,"%s VIRTUAL TABLE INDEX %d:%s",pcVar9,
                                 (ulong)(uint)psVar7->idxNum,psVar7->idxStr);
      }
    }
    else {
      pcVar9 = sqlite3MAppendf(db,pcVar9,"%s USING INTEGER PRIMARY KEY");
      if ((uVar3 >> 0xc & 1) == 0) {
        if ((uVar3 & 0x300000) == 0x300000) {
          pcVar10 = "%s (rowid>? AND rowid<?)";
        }
        else if ((uVar3 >> 0x15 & 1) == 0) {
          if ((uVar3 >> 0x14 & 1) == 0) goto LAB_001788c8;
          pcVar10 = "%s (rowid<?)";
        }
        else {
          pcVar10 = "%s (rowid>?)";
        }
      }
      else {
        pcVar10 = "%s (rowid=?)";
      }
      pcVar9 = sqlite3MAppendf(db,pcVar9,pcVar10,pcVar9);
    }
  }
  else {
    pIVar4 = (pLevel->plan).u.pIdx;
    uVar2 = (pLevel->plan).nEq;
    pCVar5 = (pTabList->a[bVar1].pTab)->aCol;
    piVar6 = pIVar4->aiColumn;
    if ((uVar2 == 0) && (((pLevel->plan).wsFlags & 0x300000) == 0)) {
      pcVar10 = (char *)0x0;
    }
    else {
      local_58.zBase = (char *)0x0;
      local_58.zText = (char *)0x0;
      local_58.nChar = 0;
      local_58.nAlloc = 0;
      local_58.mxAlloc = 1000000000;
      local_58.tooBig = '\0';
      local_58.mallocFailed = '\0';
      local_58.useMalloc = '\x01';
      local_58.db = db;
      sqlite3StrAccumAppend(&local_58," (",2);
      uVar17 = (ulong)uVar2;
      for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
        explainAppendTerm(&local_58,(int)uVar11,pCVar5[piVar6[uVar11]].zName,"=");
      }
      uVar8 = (pLevel->plan).wsFlags;
      iTerm = (uint)uVar2;
      if ((uVar8 >> 0x15 & 1) != 0) {
        if (uVar2 == pIVar4->nColumn) {
          pcVar10 = "rowid";
        }
        else {
          pcVar10 = pCVar5[piVar6[uVar17]].zName;
        }
        explainAppendTerm(&local_58,iTerm,pcVar10,">");
        uVar8 = (pLevel->plan).wsFlags;
        iTerm = iTerm + 1;
      }
      if ((uVar8 >> 0x14 & 1) != 0) {
        if (uVar2 == pIVar4->nColumn) {
          pcVar10 = "rowid";
        }
        else {
          pcVar10 = pCVar5[piVar6[uVar17]].zName;
        }
        explainAppendTerm(&local_58,iTerm,pcVar10,"<");
      }
      sqlite3StrAccumAppend(&local_58,")",1);
      pcVar10 = sqlite3StrAccumFinish(&local_58);
    }
    pcVar15 = "";
    pcVar14 = "COVERING ";
    if ((uVar3 >> 0x16 & 1) == 0) {
      pcVar14 = "";
    }
    pcVar12 = "AUTOMATIC ";
    bVar18 = (uVar3 & 0x20000000) != 0;
    if (!bVar18) {
      pcVar12 = "";
    }
    pcVar16 = " ";
    if (bVar18) {
      pcVar16 = "";
    }
    else {
      pcVar15 = ((pLevel->plan).u.pIdx)->zName;
    }
    pcVar9 = sqlite3MAppendf(db,pcVar9,"%s USING %s%sINDEX%s%s%s",pcVar9,pcVar12,pcVar14,pcVar16,
                             pcVar15,pcVar10);
    sqlite3DbFree(db,pcVar10);
  }
LAB_001788c8:
  if ((wctrlFlags & 3) == 0) {
    lVar13 = (long)(pLevel->plan).nRow;
  }
  else {
    lVar13 = 1;
  }
  pcVar9 = sqlite3MAppendf(db,pcVar9,"%s (~%lld rows)",pcVar9,lVar13);
  sqlite3VdbeAddOp4(p,0x96,p1,iLevel,iFrom,pcVar9,-1);
  return;
}

Assistant:

static void explainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  int iLevel,                     /* Value for "level" column of output */
  int iFrom,                      /* Value for "from" column of output */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  if( pParse->explain==2 ){
    u32 flags = pLevel->plan.wsFlags;
    struct SrcList_item *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    char *zMsg;                   /* Text to add to EQP output */
    sqlite3_int64 nRow;           /* Expected number of rows visited by scan */
    int iId = pParse->iSelectId;  /* Select id (left-most output column) */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */

    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_ONETABLE_ONLY) ) return;

    isSearch = (pLevel->plan.nEq>0)
             || (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
             || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    zMsg = sqlite3MPrintf(db, "%s", isSearch?"SEARCH":"SCAN");
    if( pItem->pSelect ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s SUBQUERY %d", zMsg,pItem->iSelectId);
    }else{
      zMsg = sqlite3MAppendf(db, zMsg, "%s TABLE %s", zMsg, pItem->zName);
    }

    if( pItem->zAlias ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s AS %s", zMsg, pItem->zAlias);
    }
    if( (flags & WHERE_INDEXED)!=0 ){
      char *zWhere = explainIndexRange(db, pLevel, pItem->pTab);
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING %s%sINDEX%s%s%s", zMsg, 
          ((flags & WHERE_TEMP_INDEX)?"AUTOMATIC ":""),
          ((flags & WHERE_IDX_ONLY)?"COVERING ":""),
          ((flags & WHERE_TEMP_INDEX)?"":" "),
          ((flags & WHERE_TEMP_INDEX)?"": pLevel->plan.u.pIdx->zName),
          zWhere
      );
      sqlite3DbFree(db, zWhere);
    }else if( flags & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      zMsg = sqlite3MAppendf(db, zMsg, "%s USING INTEGER PRIMARY KEY", zMsg);

      if( flags&WHERE_ROWID_EQ ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid=?)", zMsg);
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>? AND rowid<?)", zMsg);
      }else if( flags&WHERE_BTM_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid>?)", zMsg);
      }else if( flags&WHERE_TOP_LIMIT ){
        zMsg = sqlite3MAppendf(db, zMsg, "%s (rowid<?)", zMsg);
      }
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_index_info *pVtabIdx = pLevel->plan.u.pVtabIdx;
      zMsg = sqlite3MAppendf(db, zMsg, "%s VIRTUAL TABLE INDEX %d:%s", zMsg,
                  pVtabIdx->idxNum, pVtabIdx->idxStr);
    }
#endif
    if( wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX) ){
      testcase( wctrlFlags & WHERE_ORDERBY_MIN );
      nRow = 1;
    }else{
      nRow = (sqlite3_int64)pLevel->plan.nRow;
    }
    zMsg = sqlite3MAppendf(db, zMsg, "%s (~%lld rows)", zMsg, nRow);
    sqlite3VdbeAddOp4(v, OP_Explain, iId, iLevel, iFrom, zMsg, P4_DYNAMIC);
  }
}